

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall
QMessageBox::QMessageBox
          (QMessageBox *this,Icon icon,QString *title,QString *text,StandardButtons buttons,
          QWidget *parent,WindowFlags f)

{
  QDialogPrivate *this_00;
  
  this_00 = (QDialogPrivate *)operator_new(0x3b0);
  QDialogPrivate::QDialogPrivate(this_00);
  *(undefined ***)&this_00->super_QWidgetPrivate = &PTR__QMessageBoxPrivate_00804af0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x28 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x30 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x40 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x48 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x50 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x58 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x59 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x61 = 0;
  this_00[1].super_QWidgetPrivate.field_0x69 = 1;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x70 = 0;
  this_00[1].super_QWidgetPrivate.extra._M_t.
  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = (QWExtra *)0x0;
  this_00[1].super_QWidgetPrivate.focus_next = (QWidget *)0x0;
  this_00[1].super_QWidgetPrivate.focus_prev = (QWidget *)0x0;
  this_00[1].super_QWidgetPrivate.focus_child = (QWidget *)0x0;
  this_00[1].super_QWidgetPrivate.layout = (QLayout *)0x0;
  this_00[1].super_QWidgetPrivate.needsFlush = (QRegion *)0x0;
  this_00[1].super_QWidgetPrivate.redirectDev = (QPaintDevice *)0x0;
  this_00[1].super_QWidgetPrivate.widgetItem = (QWidgetItemV2 *)0x0;
  this_00[1].super_QWidgetPrivate.extraPaintEngine = (QPaintEngine *)0x0;
  QMessageDialogOptions::create();
  QDialog::QDialog(&this->super_QDialog,this_00,parent,
                   (WindowFlags)
                   ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i | 0x8003100));
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_008045a0;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QMessageBox_00804778;
  QMessageBoxPrivate::init
            (*(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)title);
  setIcon(this,icon);
  if ((QFlagsStorage<QMessageBox::StandardButton>)
      buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
      super_QFlagsStorage<QMessageBox::StandardButton>.i !=
      (QFlagsStorage<QMessageBox::StandardButton>)0x0) {
    setStandardButtons(this,buttons);
    return;
  }
  return;
}

Assistant:

QMessageBox::QMessageBox(Icon icon, const QString &title, const QString &text,
                         StandardButtons buttons, QWidget *parent,
                         Qt::WindowFlags f)
: QDialog(*new QMessageBoxPrivate, parent, f | Qt::MSWindowsFixedSizeDialogHint | Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init(title, text);
    setIcon(icon);
    if (buttons != NoButton)
        setStandardButtons(buttons);
}